

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

DecodeStatus decodeBDAddr12Operand(MCInst *Inst,uint64_t Field,uint *Regs)

{
  long in_RDX;
  ulong in_RSI;
  MCInst *in_RDI;
  uint64_t Disp;
  uint64_t Base;
  undefined4 local_34;
  
  if (in_RSI >> 0xc == 0) {
    local_34 = 0;
  }
  else {
    local_34 = *(uint *)(in_RDX + (in_RSI >> 0xc) * 4);
  }
  MCOperand_CreateReg0(in_RDI,local_34);
  MCOperand_CreateImm0(in_RDI,in_RSI & 0xfff);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus decodeBDAddr12Operand(MCInst *Inst, uint64_t Field,
		const unsigned *Regs)
{
	uint64_t Base = Field >> 12;
	uint64_t Disp = Field & 0xfff;
	//assert(Base < 16 && "Invalid BDAddr12");

	MCOperand_CreateReg0(Inst, Base == 0 ? 0 : Regs[Base]);
	MCOperand_CreateImm0(Inst, Disp);

	return MCDisassembler_Success;
}